

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O2

int run_test_fs_copyfile(void)

{
  int iVar1;
  uv_loop_t *loop;
  char *pcVar2;
  undefined8 uStack_1f0;
  char src [14];
  uv_fs_t req;
  
  builtin_strncpy(src + 8,"e_src",6);
  builtin_strncpy(src,"test_fil",8);
  loop = uv_default_loop();
  iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",-1,(uv_fs_cb)0x0);
  if (iVar1 == -0x16) {
    uv_fs_req_cleanup(&req);
    unlink(src);
    unlink("test_file_dst");
    iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,(uv_fs_cb)0x0);
    if (req.result == -2) {
      if (iVar1 == -2) {
        uv_fs_req_cleanup(&req);
        iVar1 = uv_fs_stat((uv_loop_t *)0x0,&req,"test_file_dst",(uv_fs_cb)0x0);
        if (iVar1 == 0) {
          pcVar2 = "r != 0";
          uStack_1f0 = 0x78;
        }
        else {
          uv_fs_req_cleanup(&req);
          touch_file(src,0xc);
          iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,src,0,(uv_fs_cb)0x0);
          if (iVar1 == 0) {
            uv_fs_req_cleanup(&req);
            unlink(src);
            unlink("test_file_dst");
            iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,"test/fixtures/load_error.node",
                                   "test_file_dst",0,(uv_fs_cb)0x0);
            if (iVar1 == 0) {
              handle_result(&req);
              unlink("test_file_dst");
              touch_file(src,0);
              iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,(uv_fs_cb)0x0);
              if (iVar1 == 0) {
                handle_result(&req);
                iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,"test/fixtures/load_error.node",
                                       "test_file_dst",0,(uv_fs_cb)0x0);
                if (iVar1 == 0) {
                  handle_result(&req);
                  iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,"test/fixtures/load_error.node",
                                         "test_file_dst",1,(uv_fs_cb)0x0);
                  if (iVar1 == -0x11) {
                    uv_fs_req_cleanup(&req);
                    touch_file(src,1);
                    iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,(uv_fs_cb)0x0
                                          );
                    if (iVar1 == 0) {
                      handle_result(&req);
                      unlink("test_file_dst");
                      touch_file(src,0x2000);
                      iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,
                                             (uv_fs_cb)0x0);
                      if (iVar1 == 0) {
                        handle_result(&req);
                        unlink(src);
                        unlink("test_file_dst");
                        iVar1 = uv_fs_copyfile(loop,&req,"test/fixtures/load_error.node",
                                               "test_file_dst",0,handle_result);
                        if (iVar1 == 0) {
                          if (result_check_count == 5) {
                            uv_run(loop,UV_RUN_DEFAULT);
                            if (result_check_count == 6) {
                              unlink("test_file_dst");
                              iVar1 = uv_fs_copyfile(loop,&req,"test/fixtures/load_error.node",
                                                     "test_file_dst",-1,fail_cb);
                              if (iVar1 == -0x16) {
                                uv_run(loop,UV_RUN_DEFAULT);
                                unlink("test_file_dst");
                                iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,
                                                       "test/fixtures/load_error.node",
                                                       "test_file_dst",2,(uv_fs_cb)0x0);
                                if (iVar1 == 0) {
                                  handle_result(&req);
                                  unlink("test_file_dst");
                                  iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,
                                                         "test/fixtures/load_error.node",
                                                         "test_file_dst",4,(uv_fs_cb)0x0);
                                  if (iVar1 < 1) {
                                    if (iVar1 == 0) {
                                      handle_result(&req);
                                    }
                                    unlink("test_file_dst");
                                    touch_file("test_file_dst",0);
                                    chmod("test_file_dst",0x124);
                                    iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,
                                                           "test/fixtures/load_error.node",
                                                           "test_file_dst",0,(uv_fs_cb)0x0);
                                    if (req.result == -0xd) {
                                      if (iVar1 == -0xd) {
                                        uv_fs_req_cleanup(&req);
                                        unlink("test_file_dst");
                                        return 0;
                                      }
                                      pcVar2 = "r == UV_EACCES";
                                      uStack_1f0 = 0xcd;
                                    }
                                    else {
                                      pcVar2 = "req.result == UV_EACCES";
                                      uStack_1f0 = 0xcc;
                                    }
                                  }
                                  else {
                                    pcVar2 = "r <= 0";
                                    uStack_1f0 = 0xbf;
                                  }
                                }
                                else {
                                  pcVar2 = "r == 0";
                                  uStack_1f0 = 0xb8;
                                }
                              }
                              else {
                                pcVar2 = "r == UV_EINVAL";
                                uStack_1f0 = 0xb2;
                              }
                            }
                            else {
                              pcVar2 = "result_check_count == 6";
                              uStack_1f0 = 0xad;
                            }
                          }
                          else {
                            pcVar2 = "result_check_count == 5";
                            uStack_1f0 = 0xab;
                          }
                        }
                        else {
                          pcVar2 = "r == 0";
                          uStack_1f0 = 0xaa;
                        }
                      }
                      else {
                        pcVar2 = "r == 0";
                        uStack_1f0 = 0xa3;
                      }
                    }
                    else {
                      pcVar2 = "r == 0";
                      uStack_1f0 = 0x9c;
                    }
                  }
                  else {
                    pcVar2 = "r == UV_EEXIST";
                    uStack_1f0 = 0x96;
                  }
                }
                else {
                  pcVar2 = "r == 0";
                  uStack_1f0 = 0x91;
                }
              }
              else {
                pcVar2 = "r == 0";
                uStack_1f0 = 0x8c;
              }
            }
            else {
              pcVar2 = "r == 0";
              uStack_1f0 = 0x85;
            }
          }
          else {
            pcVar2 = "r == 0";
            uStack_1f0 = 0x7e;
          }
        }
      }
      else {
        pcVar2 = "r == UV_ENOENT";
        uStack_1f0 = 0x74;
      }
    }
    else {
      pcVar2 = "req.result == UV_ENOENT";
      uStack_1f0 = 0x73;
    }
  }
  else {
    pcVar2 = "r == UV_EINVAL";
    uStack_1f0 = 0x6c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-copyfile.c"
          ,uStack_1f0,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(fs_copyfile) {
  const char src[] = "test_file_src";
  uv_loop_t* loop;
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Fails with EINVAL if bad flags are passed. */
  r = uv_fs_copyfile(NULL, &req, src, dst, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&req);

  /* Fails with ENOENT if source does not exist. */
  unlink(src);
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(req.result == UV_ENOENT);
  ASSERT(r == UV_ENOENT);
  uv_fs_req_cleanup(&req);
  /* The destination should not exist. */
  r = uv_fs_stat(NULL, &req, dst, NULL);
  ASSERT(r != 0);
  uv_fs_req_cleanup(&req);

  /* Succeeds if src and dst files are identical. */
  touch_file(src, 12);
  r = uv_fs_copyfile(NULL, &req, src, src, 0, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);
  unlink(src);

  /* Copies file synchronously. Creates new file. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a file of size zero. */
  unlink(dst);
  touch_file(src, 0);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file synchronously. Overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Fails to overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_EXCL, NULL);
  ASSERT(r == UV_EEXIST);
  uv_fs_req_cleanup(&req);

  /* Truncates when an existing destination is larger than the source file. */
  touch_file(src, 1);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a larger file. */
  unlink(dst);
  touch_file(src, 4096 * 2);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);
  unlink(src);

  /* Copies file asynchronously */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, 0, handle_result);
  ASSERT(r == 0);
  ASSERT(result_check_count == 5);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(result_check_count == 6);

  /* If the flags are invalid, the loop should not be kept open */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);

  /* Copies file using UV_FS_COPYFILE_FICLONE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file using UV_FS_COPYFILE_FICLONE_FORCE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE_FORCE,
                     NULL);
  ASSERT(r <= 0);

  if (r == 0)
    handle_result(&req);

#ifndef _WIN32
  /* Copying respects permissions/mode. */
  unlink(dst);
  touch_file(dst, 0);
  chmod(dst, S_IRUSR|S_IRGRP|S_IROTH); /* Sets file mode to 444 (read-only). */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  /* On IBMi PASE, qsecofr users can overwrite read-only files */
# ifndef __PASE__
  ASSERT(req.result == UV_EACCES);
  ASSERT(r == UV_EACCES);
# endif
  uv_fs_req_cleanup(&req);
#endif

  unlink(dst); /* Cleanup */
  return 0;
}